

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O0

ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>
testing::ValuesIn<(anonymous_namespace)::nonUniformTileConfigParam,6ul>
          (anon_struct_524_5_7b11162c_for__M_head_impl (*array) [6])

{
  element_type *in_RDI;
  ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam> PVar1;
  anon_struct_524_5_7b11162c_for__M_head_impl *in_stack_00000010;
  anon_struct_524_5_7b11162c_for__M_head_impl *in_stack_00000018;
  
  PVar1 = ValuesIn<(anonymous_namespace)::nonUniformTileConfigParam_const*>
                    (in_stack_00000018,in_stack_00000010);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}